

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_resume(http_pause_handle_s *http,_func_void_http_s_ptr *task,_func_void_void_ptr *fallback
                )

{
  undefined1 auVar1 [32];
  undefined4 uStack_3c;
  _func_void_void_ptr *fallback_local;
  _func_void_http_s_ptr *task_local;
  http_pause_handle_s *http_local;
  
  if (http != (http_pause_handle_s *)0x0) {
    http->task = task;
    http->fallback = fallback;
    auVar1._4_8_ = http_resume_wrapper;
    auVar1._0_4_ = uStack_3c;
    auVar1._12_8_ = http;
    auVar1._20_8_ = http_resume_fallback_wrapper;
    auVar1._28_4_ = 0;
    fio_defer_io_task(http->uuid,(fio_defer_iotask_args_s)(auVar1 << 0x20));
  }
  return;
}

Assistant:

void http_resume(http_pause_handle_s *http, void (*task)(http_s *h),
                 void (*fallback)(void *udata)) {
  if (!http)
    return;
  http->task = task;
  http->fallback = fallback;
  fio_defer_io_task(http->uuid, .udata = http, .type = FIO_PR_LOCK_TASK,
                    .task = http_resume_wrapper,
                    .fallback = http_resume_fallback_wrapper);
}